

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

MemPage * MemPage_create(size_t capacity)

{
  MemPage *page;
  size_t capacity_local;
  
  capacity_local = (size_t)deMalloc(capacity + 0x10);
  if ((MemPage *)capacity_local == (MemPage *)0x0) {
    capacity_local = 0;
  }
  else {
    MemPage_init((MemPage *)capacity_local,capacity);
  }
  return (MemPage *)capacity_local;
}

Assistant:

static MemPage* MemPage_create (size_t capacity)
{
	MemPage* page = (MemPage*)deMalloc(sizeof(MemPage) + capacity);
	if (!page)
		return DE_NULL;

	DE_ASSERT(deIsAlignedPtr(page+1, MEM_PAGE_BASE_ALIGN));

	MemPage_init(page, capacity);
	return page;
}